

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_optional_asn1_octet_string(CBS *cbs,CBS *out,int *out_present,CBS_ASN1_TAG tag)

{
  int iVar1;
  int iVar2;
  int present;
  CBS child;
  int local_2c;
  CBS local_28;
  
  iVar1 = CBS_get_optional_asn1(cbs,&local_28,&local_2c,tag);
  iVar2 = 0;
  if (iVar1 != 0) {
    if (local_2c == 0) {
      out->data = (uint8_t *)0x0;
      out->len = 0;
    }
    else {
      if (out == (CBS *)0x0) {
        __assert_fail("out",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                      ,0x234,
                      "int CBS_get_optional_asn1_octet_string(CBS *, CBS *, int *, CBS_ASN1_TAG)");
      }
      iVar1 = cbs_get_asn1(&local_28,out,4,1);
      if (iVar1 == 0) {
        return 0;
      }
      if (local_28.len != 0) {
        return 0;
      }
    }
    iVar2 = 1;
    if (out_present != (int *)0x0) {
      *out_present = local_2c;
    }
  }
  return iVar2;
}

Assistant:

int CBS_get_optional_asn1_octet_string(CBS *cbs, CBS *out, int *out_present,
                                       CBS_ASN1_TAG tag) {
  CBS child;
  int present;
  if (!CBS_get_optional_asn1(cbs, &child, &present, tag)) {
    return 0;
  }
  if (present) {
    assert(out);
    if (!CBS_get_asn1(&child, out, CBS_ASN1_OCTETSTRING) ||
        CBS_len(&child) != 0) {
      return 0;
    }
  } else {
    CBS_init(out, NULL, 0);
  }
  if (out_present) {
    *out_present = present;
  }
  return 1;
}